

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatFinalize(sqlite3_context *context)

{
  Mem *p;
  StrAccum *p_00;
  char *z;
  
  p = context->pMem;
  if ((p->flags & 0x2000) == 0) {
    sqlite3VdbeMemReleaseExternal(p);
    p->flags = 1;
    p->z = (char *)0x0;
  }
  p_00 = (StrAccum *)p->z;
  if (p_00 != (StrAccum *)0x0) {
    if (p_00->tooBig != '\0') {
      context->isError = 0x12;
      sqlite3VdbeMemSetStr
                (&context->s,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
      return;
    }
    if (p_00->mallocFailed == '\0') {
      z = sqlite3StrAccumFinish(p_00);
      setResultStrOrError(context,z,-1,'\x01',sqlite3_free);
      return;
    }
    sqlite3VdbeMemSetNull(&context->s);
    context->isError = 7;
    ((context->s).db)->mallocFailed = '\x01';
  }
  return;
}

Assistant:

static void groupConcatFinalize(sqlite3_context *context){
  StrAccum *pAccum;
  pAccum = sqlite3_aggregate_context(context, 0);
  if( pAccum ){
    if( pAccum->tooBig ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->mallocFailed ){
      sqlite3_result_error_nomem(context);
    }else{    
      sqlite3_result_text(context, sqlite3StrAccumFinish(pAccum), -1, 
                          sqlite3_free);
    }
  }
}